

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O0

String * __thiscall axl::zip::ZipReader::getFileName(ZipReader *this,size_t index)

{
  mz_zip_archive *pZip;
  size_t in_RSI;
  String *in_RDI;
  bool in_stack_0000000f;
  size_t in_stack_00000010;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_00000018;
  char *p;
  size_t size;
  String *fileName;
  String *this_00;
  mz_uint file_index;
  mz_zip_archive *in_stack_ffffffffffffffb8;
  
  file_index = 0;
  this_00 = in_RDI;
  mz_zip_reader_get_filename(in_stack_ffffffffffffffb8,0,(char *)in_RDI,(mz_uint)(in_RSI >> 0x20));
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x169893);
  pZip = (mz_zip_archive *)
         sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                   (in_stack_00000018,in_stack_00000010,in_stack_0000000f);
  mz_zip_reader_get_filename(pZip,file_index,(char *)this_00,(mz_uint)(in_RSI >> 0x20));
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::chop(this_00,in_RSI);
  return in_RDI;
}

Assistant:

sl::String
ZipReader::getFileName(size_t index) const {
	ASSERT(isOpen());
	size_t size = mz_zip_reader_get_filename(m_zip, index, NULL, 0);

	sl::String fileName;
	char* p = fileName.createBuffer(size);
	mz_zip_reader_get_filename(m_zip, index, p, size);
	fileName.chop(1);
	return fileName;
}